

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

Maybe<kj::ArrayPtr<const_unsigned_char>_> * __thiscall
kj::Exception::getDetail
          (Maybe<kj::ArrayPtr<const_unsigned_char>_> *__return_storage_ptr__,Exception *this,
          DetailTypeId typeId)

{
  ArrayPtr<const_unsigned_char> local_50;
  Detail *local_40;
  Detail *detail;
  Detail *__end1;
  Detail *__begin1;
  Vector<kj::Exception::Detail> *__range1;
  DetailTypeId typeId_local;
  Exception *this_local;
  
  __begin1 = (Detail *)&this->details;
  __range1 = (Vector<kj::Exception::Detail> *)typeId;
  typeId_local = (DetailTypeId)this;
  this_local = (Exception *)__return_storage_ptr__;
  __end1 = Vector<kj::Exception::Detail>::begin((Vector<kj::Exception::Detail> *)__begin1);
  detail = Vector<kj::Exception::Detail>::end((Vector<kj::Exception::Detail> *)__begin1);
  while( true ) {
    if (__end1 == detail) {
      Maybe<kj::ArrayPtr<const_unsigned_char>_>::Maybe(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_40 = __end1;
    if ((Vector<kj::Exception::Detail> *)__end1->id == __range1) break;
    __end1 = __end1 + 1;
  }
  local_50 = (ArrayPtr<const_unsigned_char>)Array<unsigned_char>::asPtr(&__end1->value);
  Maybe<kj::ArrayPtr<const_unsigned_char>_>::Maybe(__return_storage_ptr__,&local_50);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::ArrayPtr<const byte>> Exception::getDetail(DetailTypeId typeId) const {
  for (auto& detail: details) {
    if (detail.id == typeId) {
      return detail.value.asPtr();
    }
  }
  return kj::none;
}